

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOutJSON::out_ref
          (ChArchiveOutJSON *this,ChValue *bVal,bool already_inserted,size_t obj_ID,size_t ext_ID)

{
  uint uVar1;
  reference pvVar2;
  ChStreamOutAscii *pCVar3;
  char *pcVar4;
  size_t sVar5;
  reference pvVar6;
  value_type local_3d;
  value_type local_3c;
  char *local_38;
  char *classname;
  size_t ext_ID_local;
  size_t obj_ID_local;
  ChValue *pCStack_18;
  bool already_inserted_local;
  ChValue *bVal_local;
  ChArchiveOutJSON *this_local;
  
  classname = (char *)ext_ID;
  ext_ID_local = obj_ID;
  obj_ID_local._7_1_ = already_inserted;
  pCStack_18 = bVal;
  bVal_local = (ChValue *)this;
  (*bVal->_vptr_ChValue[3])();
  local_38 = (char *)std::__cxx11::string::c_str();
  comma_cr(this);
  pvVar2 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&this->is_array);
  if ((*pvVar2 & 1U) == 0) {
    indent(this);
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pcVar4 = ChValue::name(pCStack_18);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,pcVar4);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\t: \n");
  }
  indent(this);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"{ ");
  *(int *)&(this->super_ChArchiveOut).field_0x104 =
       *(int *)&(this->super_ChArchiveOut).field_0x104 + 1;
  local_3c = 0;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->nitems,&local_3c);
  local_3d = false;
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&this->is_array,&local_3d);
  sVar5 = strlen(local_38);
  if (sVar5 != 0) {
    comma_cr(this);
    indent(this);
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_type\"\t: ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"\"");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,local_38);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\"");
    pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
    *pvVar6 = *pvVar6 + 1;
  }
  if ((obj_ID_local._7_1_ & 1) == 0) {
    comma_cr(this);
    indent(this);
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_object_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar3,ext_ID_local);
    pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
    *pvVar6 = *pvVar6 + 1;
    (*pCStack_18->_vptr_ChValue[0xe])(pCStack_18,this);
    (*pCStack_18->_vptr_ChValue[0xd])(pCStack_18,this);
  }
  else {
    if ((ext_ID_local != 0) || (uVar1 = (*pCStack_18->_vptr_ChValue[7])(), (uVar1 & 1) != 0)) {
      comma_cr(this);
      indent(this);
      pCVar3 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<
                         ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_reference_ID\"\t: ");
      chrono::ChStreamOutAscii::operator<<(pCVar3,ext_ID_local);
      pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
      *pvVar6 = *pvVar6 + 1;
    }
    if (classname != (char *)0x0) {
      comma_cr(this);
      indent(this);
      pCVar3 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<
                         ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_external_ID\"\t: ");
      chrono::ChStreamOutAscii::operator<<(pCVar3,(ulong)classname);
      pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
      *pvVar6 = *pvVar6 + 1;
    }
  }
  *(int *)&(this->super_ChArchiveOut).field_0x104 =
       *(int *)&(this->super_ChArchiveOut).field_0x104 + -1;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->nitems);
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&this->is_array);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\n");
  indent(this);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"}");
  pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
  *pvVar6 = *pvVar6 + 1;
  return;
}

Assistant:

virtual void out_ref          (ChValue& bVal,  bool already_inserted, size_t obj_ID, size_t ext_ID)  {
          const char* classname = bVal.GetClassRegisteredName().c_str();
          comma_cr();
		  if (is_array.top() == false) {
			  indent();
			  (*ostream) << "\"" << bVal.name() << "\"" << "\t: \n";
		  }
          indent();
          (*ostream) << "{ ";
          
          ++tablevel;
          nitems.push(0);
          is_array.push(false);

          if(strlen(classname)>0) {
              comma_cr();
              indent();
              (*ostream) << "\"_type\"\t: "  << "\"" << classname << "\"";
              ++nitems.top();
          }
          
          if (!already_inserted) {
            comma_cr();
            indent();
            (*ostream) << "\"_object_ID\"\t: "  << obj_ID;
            ++nitems.top();
          
            // New Object, we have to full serialize it
            bVal.CallArchiveOutConstructor(*this);
            bVal.CallArchiveOut(*this);
          } else {
              if (obj_ID || bVal.IsNull() ) {
                comma_cr();
                indent();
                (*ostream) << "\"_reference_ID\"\t: "  << obj_ID;
                ++nitems.top();
              }
              if (ext_ID) {
                comma_cr();
                indent();
                (*ostream) << "\"_external_ID\"\t: "  << ext_ID;
                ++nitems.top();
              }
          }
          --tablevel;
          nitems.pop();
          is_array.pop();

          (*ostream) << "\n";
          indent();
          (*ostream) << "}";
          ++nitems.top();
      }